

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
               (ParamsStream<DataStream_&,_TransactionSerParams> *is,
               shared_ptr<const_CTransaction> *p)

{
  shared_ptr<const_CTransaction> *in_RSI;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *in_stack_ffffffffffffffc8;
  shared_ptr<const_CTransaction> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffff0;
  deserialize_type *__args;
  
  __args = *(deserialize_type **)(in_FS_OFFSET + 0x28);
  __r = (shared_ptr<const_CTransaction> *)&stack0xffffffffffffffe8;
  std::
  make_shared<CTransaction_const,deserialize_type_const&,ParamsStream<DataStream&,TransactionSerParams>&>
            (__args,(ParamsStream<DataStream_&,_TransactionSerParams> *)
                    in_stack_fffffffffffffff0._M_pi);
  std::shared_ptr<const_CTransaction>::operator=(in_RSI,__r);
  std::shared_ptr<const_CTransaction>::~shared_ptr(in_stack_ffffffffffffffc8);
  if (*(deserialize_type **)(in_FS_OFFSET + 0x28) == __args) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::shared_ptr<const T>& p)
{
    p = std::make_shared<const T>(deserialize, is);
}